

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf_save.c
# Opt level: O0

int smf_save(smf_t *smf,char *file_name)

{
  int iVar1;
  smf_track_t *track_00;
  smf_track_t *track;
  int error;
  int i;
  char *file_name_local;
  smf_t *smf_local;
  
  smf_rewind(smf);
  iVar1 = pointers_are_clear(smf);
  if (iVar1 == 0) {
    __assert_fail("pointers_are_clear(smf)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                  ,0x26f,"int smf_save(smf_t *, const char *)");
  }
  iVar1 = smf_validate(smf);
  if (iVar1 == 0) {
    iVar1 = write_mthd_header(smf);
    if (iVar1 == 0) {
      for (track._4_4_ = 1; track._4_4_ <= smf->number_of_tracks; track._4_4_ = track._4_4_ + 1) {
        track_00 = smf_get_track_by_number(smf,track._4_4_);
        if (track_00 == (smf_track_t *)0x0) {
          __assert_fail("track != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                        ,0x27a,"int smf_save(smf_t *, const char *)");
        }
        iVar1 = write_track(track_00);
        if (iVar1 != 0) {
          free_buffer(smf);
          return iVar1;
        }
      }
      smf_local._4_4_ = write_file(smf,file_name);
      free_buffer(smf);
      if (smf_local._4_4_ == 0) {
        assert_smf_saved_correctly(smf,file_name);
        smf_local._4_4_ = 0;
      }
    }
    else {
      smf_local._4_4_ = -2;
    }
  }
  else {
    smf_local._4_4_ = -1;
  }
  return smf_local._4_4_;
}

Assistant:

int
smf_save(smf_t *smf, const char *file_name)
{
	int i, error;
	smf_track_t *track;

	smf_rewind(smf);

	assert(pointers_are_clear(smf));

	if (smf_validate(smf))
		return (-1);

	if (write_mthd_header(smf))
		return (-2);

	for (i = 1; i <= smf->number_of_tracks; i++) {
		track = smf_get_track_by_number(smf, i);

		assert(track != NULL);

		error = write_track(track);
		if (error) {
			free_buffer(smf);
			return (error);
		}
	}

	error = write_file(smf, file_name);

	free_buffer(smf);

	if (error)
		return (error);

#ifndef NDEBUG
	assert_smf_saved_correctly(smf, file_name);
#endif

	return (0);
}